

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TransformFeedback::ProgramSpec::addTransformFeedbackVarying
          (ProgramSpec *this,char *name)

{
  allocator<char> local_39;
  value_type local_38;
  char *local_18;
  char *name_local;
  ProgramSpec *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_transformFeedbackVaryings,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ProgramSpec::addTransformFeedbackVarying (const char* name)
{
	m_transformFeedbackVaryings.push_back(name);
}